

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O1

PrimInfo * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefArrayMB
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,PrimRef *prims,BBox1f *time_range,range<unsigned_long> *r,size_t k,uint geomID)

{
  BBox1f BVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  long lVar4;
  long lVar5;
  bool bVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  uint uVar18;
  char *pcVar19;
  size_t sVar20;
  ulong uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  float fVar53;
  undefined1 auVar52 [16];
  float fVar57;
  float fVar58;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar59;
  undefined1 auVar56 [16];
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  size_t local_1c8;
  size_t local_1c0;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  ulong local_120;
  anon_class_16_2_07cfa4d6 local_118;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_108;
  undefined1 local_f8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_e8;
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [16];
  undefined1 local_a8 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_98;
  undefined1 local_88 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_78;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0.
  m128[3] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[0] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[1] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[2] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0.
  m128[3] = INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[0] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[1] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[2] = -INFINITY;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0.
  m128[3] = -INFINITY;
  __return_storage_ptr__->begin = SUB168(ZEXT816(0) << 0x20,0);
  __return_storage_ptr__->end = SUB168(ZEXT816(0) << 0x20,8);
  auVar26._8_8_ = 0;
  auVar26._0_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.lower;
  auVar26._4_4_ =
       (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
       super_Geometry.time_range.upper;
  auVar30._8_8_ = 0;
  auVar30._0_4_ = time_range->lower;
  auVar30._4_4_ = time_range->upper;
  uVar21 = vcmpps_avx512vl(auVar26,auVar30,1);
  auVar27 = vinsertps_avx(auVar30,auVar26,0x50);
  auVar26 = vinsertps_avx(auVar26,auVar30,0x50);
  bVar6 = (bool)((byte)uVar21 & 1);
  local_b8._0_4_ = (float)((uint)bVar6 * auVar27._0_4_ | (uint)!bVar6 * auVar26._0_4_);
  bVar6 = (bool)((byte)(uVar21 >> 1) & 1);
  local_b8._4_4_ = (uint)bVar6 * auVar27._4_4_ | (uint)!bVar6 * auVar26._4_4_;
  bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
  local_b8._8_4_ = (uint)bVar6 * auVar27._8_4_ | (uint)!bVar6 * auVar26._8_4_;
  bVar6 = (bool)((byte)(uVar21 >> 3) & 1);
  local_b8._12_4_ = (uint)bVar6 * auVar27._12_4_ | (uint)!bVar6 * auVar26._12_4_;
  auVar39 = ZEXT1664(local_b8);
  local_c8 = vmovshdup_avx(local_b8);
  auVar40 = ZEXT1664(local_c8);
  if (local_b8._0_4_ <= local_c8._0_4_) {
    local_168 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 lower.field_0.m128;
    local_178 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
                 upper.field_0.m128;
    local_188 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 lower.field_0.m128;
    uVar21 = r->_begin;
    local_198 = *(undefined1 (*) [16])
                 (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
                 upper.field_0.m128;
    local_1c8 = __return_storage_ptr__->end;
    if (uVar21 < r->_end) {
      auVar41 = ZEXT1664(ZEXT816(0) << 0x40);
      auVar42 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
      auVar43 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
      local_1c0 = k;
      do {
        BVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                super_CurveGeometry.super_Geometry.time_range;
        auVar27._8_8_ = 0;
        auVar27._0_4_ = BVar1.lower;
        auVar27._4_4_ = BVar1.upper;
        auVar27 = vmovshdup_avx(auVar27);
        fVar25 = BVar1.lower;
        fVar57 = auVar27._0_4_ - fVar25;
        uVar15 = *(uint *)(*(long *)&(this->
                                     super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                     super_CurveGeometry.super_Geometry.field_0x58 +
                          *(long *)&(this->
                                    super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                    super_CurveGeometry.field_0x68 * uVar21);
        uVar11 = (ulong)uVar15;
        uVar12 = (ulong)(uVar15 + 1);
        pBVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                 super_CurveGeometry.vertices.items;
        if (uVar12 < (pBVar2->super_RawBufferView).num) {
          fVar23 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                   super_CurveGeometry.super_Geometry.fnumTimeSegments;
          auVar27 = ZEXT416((uint)(fVar23 * ((auVar39._0_4_ - fVar25) / fVar57) * 1.0000002));
          auVar27 = vroundss_avx(auVar27,auVar27,9);
          auVar27 = vmaxss_avx(auVar41._0_16_,auVar27);
          uVar15 = (uint)auVar27._0_4_;
          auVar27 = ZEXT416((uint)(fVar23 * ((auVar40._0_4_ - fVar25) / fVar57) * 0.99999976));
          auVar27 = vroundss_avx(auVar27,auVar27,10);
          auVar27 = vminss_avx(auVar27,ZEXT416((uint)fVar23));
          uVar18 = (uint)auVar27._0_4_;
          bVar6 = uVar18 < uVar15;
          if (uVar15 <= uVar18) {
            uVar16 = (ulong)(int)uVar15;
            lVar17 = uVar16 * 0x38;
            pcVar19 = pBVar2[uVar16].super_RawBufferView.ptr_ofs;
            sVar20 = pBVar2[uVar16].super_RawBufferView.stride;
            auVar27 = auVar42._0_16_;
            uVar9 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar19 + sVar20 * uVar11),auVar27,6);
            auVar26 = auVar43._0_16_;
            uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar19 + sVar20 * uVar11),auVar26,1);
            if ((byte)((byte)uVar9 & (byte)uVar10) == 0xf) {
              pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                       super_CurveGeometry.tangents.items;
              do {
                uVar9 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar19 + sVar20 * uVar12),auVar27,6)
                ;
                uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar19 + sVar20 * uVar12),auVar26,1
                                        );
                if ((byte)((byte)uVar9 & (byte)uVar10) != 0xf) break;
                lVar4 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar17);
                lVar5 = *(long *)((long)&(pBVar3->super_RawBufferView).stride + lVar17);
                auVar30 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar11);
                uVar9 = vcmpps_avx512vl(auVar30,auVar27,6);
                uVar10 = vcmpps_avx512vl(auVar30,auVar26,1);
                if ((byte)((byte)uVar9 & (byte)uVar10) != 0xf) break;
                auVar30 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar12);
                uVar9 = vcmpps_avx512vl(auVar30,auVar27,6);
                uVar10 = vcmpps_avx512vl(auVar30,auVar26,1);
                if ((byte)((byte)uVar9 & (byte)uVar10) != 0xf) break;
                uVar16 = uVar16 + 1;
                bVar6 = (ulong)(long)(int)uVar18 < uVar16;
                if ((ulong)(long)(int)uVar18 < uVar16) goto LAB_01f91867;
                pcVar19 = *(char **)((long)&pBVar2[1].super_RawBufferView.ptr_ofs + lVar17);
                sVar20 = *(size_t *)((long)&pBVar2[1].super_RawBufferView.stride + lVar17);
                lVar17 = lVar17 + 0x38;
                uVar9 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar19 + sVar20 * uVar11),auVar27,6)
                ;
                uVar10 = vcmpps_avx512vl(*(undefined1 (*) [16])(pcVar19 + sVar20 * uVar11),auVar26,1
                                        );
              } while ((byte)((byte)uVar9 & (byte)uVar10) == 0xf);
            }
            if (!bVar6) goto LAB_01f91ce3;
          }
LAB_01f91867:
          local_118.primID = &local_120;
          fVar57 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                   super_CurveGeometry.super_Geometry.time_range.lower;
          fVar22 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                   super_CurveGeometry.super_Geometry.time_range.upper - fVar57;
          fVar35 = (auVar39._0_4_ - fVar57) / fVar22;
          fVar22 = (auVar40._0_4_ - fVar57) / fVar22;
          fVar57 = fVar23 * fVar35;
          fVar25 = fVar23 * fVar22;
          auVar30 = vroundss_avx(ZEXT416((uint)fVar57),ZEXT416((uint)fVar57),9);
          auVar46 = vroundss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25),10);
          auVar27 = vmaxss_avx(auVar30,auVar41._0_16_);
          auVar26 = vminss_avx(auVar46,ZEXT416((uint)fVar23));
          iVar14 = (int)auVar27._0_4_;
          fVar36 = auVar26._0_4_;
          uVar15 = (int)auVar30._0_4_;
          if ((int)auVar30._0_4_ < 0) {
            uVar15 = 0xffffffff;
          }
          iVar13 = (int)fVar23 + 1;
          if ((int)auVar46._0_4_ < (int)fVar23 + 1) {
            iVar13 = (int)auVar46._0_4_;
          }
          local_120 = uVar21;
          local_118.this = this;
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_e8.field_1,&local_118,(long)iVar14);
          linearBounds::anon_class_16_2_07cfa4d6::operator()
                    ((BBox3fa *)&local_108.field_1,&local_118,(long)(int)fVar36);
          fVar57 = fVar57 - auVar27._0_4_;
          if (iVar13 - uVar15 == 1) {
            auVar27 = ZEXT816(0) << 0x40;
            auVar26 = vmaxss_avx(ZEXT416((uint)fVar57),auVar27);
            fVar23 = auVar26._0_4_;
            fVar57 = 1.0 - fVar23;
            auVar44._0_4_ = fVar23 * local_108.m128[0];
            auVar44._4_4_ = fVar23 * local_108.m128[1];
            auVar44._8_4_ = fVar23 * local_108.m128[2];
            auVar44._12_4_ = fVar23 * local_108.m128[3];
            auVar31._4_4_ = fVar57;
            auVar31._0_4_ = fVar57;
            auVar31._8_4_ = fVar57;
            auVar31._12_4_ = fVar57;
            auVar46 = vfmadd231ps_fma(auVar44,auVar31,(undefined1  [16])local_e8);
            auVar47._0_4_ = fVar23 * local_f8._0_4_;
            auVar47._4_4_ = fVar23 * local_f8._4_4_;
            auVar47._8_4_ = fVar23 * local_f8._8_4_;
            auVar47._12_4_ = fVar23 * local_f8._12_4_;
            auVar49 = vfmadd231ps_fma(auVar47,local_d8,auVar31);
            auVar26 = vmaxss_avx(ZEXT416((uint)(fVar36 - fVar25)),auVar27);
            fVar25 = auVar26._0_4_;
            fVar57 = 1.0 - fVar25;
            auVar50._0_4_ = fVar25 * local_e8.m128[0];
            auVar50._4_4_ = fVar25 * local_e8.m128[1];
            auVar50._8_4_ = fVar25 * local_e8.m128[2];
            auVar50._12_4_ = fVar25 * local_e8.m128[3];
            auVar32._4_4_ = fVar57;
            auVar32._0_4_ = fVar57;
            auVar32._8_4_ = fVar57;
            auVar32._12_4_ = fVar57;
            auVar52 = vfmadd231ps_fma(auVar50,auVar32,(undefined1  [16])local_108);
            auVar54._0_4_ = fVar25 * local_d8._0_4_;
            auVar54._4_4_ = fVar25 * local_d8._4_4_;
            auVar54._8_4_ = fVar25 * local_d8._8_4_;
            auVar54._12_4_ = fVar25 * local_d8._12_4_;
            auVar56 = vfmadd231ps_fma(auVar54,auVar32,local_f8);
          }
          else {
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_58.field_1,&local_118,(long)(iVar14 + 1));
            linearBounds::anon_class_16_2_07cfa4d6::operator()
                      ((BBox3fa *)&local_78.field_1,&local_118,(long)((int)fVar36 + -1));
            auVar27 = vmaxss_avx(ZEXT416((uint)fVar57),ZEXT816(0) << 0x40);
            fVar24 = auVar27._0_4_;
            auVar45._0_4_ = fVar24 * local_58.m128[0];
            auVar45._4_4_ = fVar24 * local_58.m128[1];
            auVar45._8_4_ = fVar24 * local_58.m128[2];
            auVar45._12_4_ = fVar24 * local_58.m128[3];
            fVar57 = 1.0 - fVar24;
            auVar28._4_4_ = fVar57;
            auVar28._0_4_ = fVar57;
            auVar28._8_4_ = fVar57;
            auVar28._12_4_ = fVar57;
            auVar46 = vfmadd231ps_fma(auVar45,auVar28,(undefined1  [16])local_e8);
            auVar48._0_4_ = fVar24 * local_48;
            auVar48._4_4_ = fVar24 * fStack_44;
            auVar48._8_4_ = fVar24 * fStack_40;
            auVar48._12_4_ = fVar24 * fStack_3c;
            auVar49 = vfmadd231ps_fma(auVar48,auVar28,local_d8);
            auVar27 = vmaxss_avx(ZEXT416((uint)(fVar36 - fVar25)),ZEXT816(0) << 0x40);
            fVar25 = auVar27._0_4_;
            fVar57 = 1.0 - fVar25;
            auVar51._0_4_ = fVar25 * local_78.m128[0];
            auVar51._4_4_ = fVar25 * local_78.m128[1];
            auVar51._8_4_ = fVar25 * local_78.m128[2];
            auVar51._12_4_ = fVar25 * local_78.m128[3];
            auVar33._4_4_ = fVar57;
            auVar33._0_4_ = fVar57;
            auVar33._8_4_ = fVar57;
            auVar33._12_4_ = fVar57;
            auVar52 = vfmadd231ps_fma(auVar51,auVar33,(undefined1  [16])local_108);
            auVar55._0_4_ = fVar25 * local_68;
            auVar55._4_4_ = fVar25 * fStack_64;
            auVar55._8_4_ = fVar25 * fStack_60;
            auVar55._12_4_ = fVar25 * fStack_5c;
            auVar56 = vfmadd231ps_fma(auVar55,auVar33,local_f8);
            if ((int)(uVar15 + 1) < iVar13) {
              sVar20 = (size_t)(uVar15 + 1);
              iVar13 = ~uVar15 + iVar13;
              do {
                fVar25 = ((float)(int)sVar20 / fVar23 - fVar35) / (fVar22 - fVar35);
                fVar57 = 1.0 - fVar25;
                auVar37._0_4_ = auVar52._0_4_ * fVar25;
                fVar36 = auVar52._4_4_;
                auVar37._4_4_ = fVar36 * fVar25;
                fVar24 = auVar52._8_4_;
                auVar37._8_4_ = fVar24 * fVar25;
                fVar53 = auVar52._12_4_;
                auVar37._12_4_ = fVar53 * fVar25;
                auVar34._4_4_ = fVar57;
                auVar34._0_4_ = fVar57;
                auVar34._8_4_ = fVar57;
                auVar34._12_4_ = fVar57;
                auVar27 = vfmadd231ps_fma(auVar37,auVar34,auVar46);
                auVar29._0_4_ = auVar56._0_4_ * fVar25;
                fVar57 = auVar56._4_4_;
                auVar29._4_4_ = fVar57 * fVar25;
                fVar58 = auVar56._8_4_;
                auVar29._8_4_ = fVar58 * fVar25;
                fVar59 = auVar56._12_4_;
                auVar29._12_4_ = fVar59 * fVar25;
                local_a8 = vfmadd231ps_fma(auVar29,auVar49,auVar34);
                linearBounds::anon_class_16_2_07cfa4d6::operator()
                          ((BBox3fa *)&local_98.field_1,&local_118,sVar20);
                local_1b8 = auVar49._0_4_;
                fStack_1b4 = auVar49._4_4_;
                fStack_1b0 = auVar49._8_4_;
                fStack_1ac = auVar49._12_4_;
                local_1a8 = auVar46._0_4_;
                fStack_1a4 = auVar46._4_4_;
                fStack_1a0 = auVar46._8_4_;
                fStack_19c = auVar46._12_4_;
                auVar27 = vsubps_avx((undefined1  [16])local_98,auVar27);
                auVar30 = vsubps_avx(local_88,local_a8);
                auVar26 = vminps_avx(auVar27,ZEXT816(0) << 0x40);
                auVar27 = vmaxps_avx(auVar30,ZEXT816(0) << 0x40);
                auVar46._0_4_ = local_1a8 + auVar26._0_4_;
                auVar46._4_4_ = fStack_1a4 + auVar26._4_4_;
                auVar46._8_4_ = fStack_1a0 + auVar26._8_4_;
                auVar46._12_4_ = fStack_19c + auVar26._12_4_;
                auVar52._0_4_ = auVar52._0_4_ + auVar26._0_4_;
                auVar52._4_4_ = fVar36 + auVar26._4_4_;
                auVar52._8_4_ = fVar24 + auVar26._8_4_;
                auVar52._12_4_ = fVar53 + auVar26._12_4_;
                auVar49._0_4_ = local_1b8 + auVar27._0_4_;
                auVar49._4_4_ = fStack_1b4 + auVar27._4_4_;
                auVar49._8_4_ = fStack_1b0 + auVar27._8_4_;
                auVar49._12_4_ = fStack_1ac + auVar27._12_4_;
                auVar56._0_4_ = auVar56._0_4_ + auVar27._0_4_;
                auVar56._4_4_ = fVar57 + auVar27._4_4_;
                auVar56._8_4_ = fVar58 + auVar27._8_4_;
                auVar56._12_4_ = fVar59 + auVar27._12_4_;
                sVar20 = sVar20 + 1;
                iVar13 = iVar13 + -1;
              } while (iVar13 != 0);
            }
            auVar27 = ZEXT816(0) << 0x40;
          }
          auVar41 = ZEXT1664(auVar27);
          uVar9 = vcmpps_avx512vl(auVar46,auVar49,2);
          auVar39 = ZEXT1664(local_b8);
          auVar40 = ZEXT1664(local_c8);
          auVar42 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
          auVar43 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
          if (((~(ushort)uVar9 & 7) == 0) &&
             (uVar9 = vcmpps_avx512vl(auVar52,auVar56,2), (~(ushort)uVar9 & 7) == 0)) {
            auVar27 = vminps_avx(auVar46,auVar52);
            aVar7 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar27,ZEXT416(geomID),0x30);
            auVar27 = vmaxps_avx(auVar49,auVar56);
            aVar8 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                    vinsertps_avx(auVar27,ZEXT416((uint)uVar21),0x30);
            auVar38._0_4_ = aVar7.x + aVar8.x;
            auVar38._4_4_ = aVar7.y + aVar8.y;
            auVar38._8_4_ = aVar7.z + aVar8.z;
            auVar38._12_4_ = aVar7.field_3.w + aVar8.field_3.w;
            local_168 = vminps_avx(local_168,(undefined1  [16])aVar7);
            local_178 = vmaxps_avx(local_178,(undefined1  [16])aVar8);
            local_188 = vminps_avx(local_188,auVar38);
            local_198 = vmaxps_avx(local_198,auVar38);
            local_1c8 = local_1c8 + 1;
            prims[local_1c0].lower.field_0.field_1 = aVar7;
            prims[local_1c0].upper.field_0.field_1 = aVar8;
            local_1c0 = local_1c0 + 1;
          }
        }
LAB_01f91ce3:
        uVar21 = uVar21 + 1;
      } while (uVar21 < r->_end);
    }
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
      field_0 = local_168._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             lower.field_0 + 8) = local_168._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
      field_0 = local_178._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.
             upper.field_0 + 8) = local_178._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = local_188._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             lower.field_0 + 8) = local_188._8_8_;
    *(undefined8 *)
     &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = local_198._0_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.
             upper.field_0 + 8) = local_198._8_8_;
    __return_storage_ptr__->end = local_1c8;
  }
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArrayMB(PrimRef* prims, const BBox1f& time_range, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        const BBox1f t0t1 = BBox1f::intersect(this->time_range, time_range);
        if (t0t1.empty()) return pinfo;
        
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbounds = linearBounds(j,t0t1);
          if (lbounds.bounds0.empty() || lbounds.bounds1.empty()) continue; // checks oriented curves with invalid normals which cause NaNs here
          const PrimRef prim(lbounds.bounds(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }